

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_iarchive.h
# Opt level: O0

void __thiscall serialization::xml_iarchive::xml_iarchive(xml_iarchive *this)

{
  xml_iarchive *this_local;
  
  rapidxml::xml_document<char>::xml_document(&this->document_);
  std::
  stack<rapidxml::xml_node<char>const*,std::deque<rapidxml::xml_node<char>const*,std::allocator<rapidxml::xml_node<char>const*>>>
  ::
  stack<std::deque<rapidxml::xml_node<char>const*,std::allocator<rapidxml::xml_node<char>const*>>,void>
            ((stack<rapidxml::xml_node<char>const*,std::deque<rapidxml::xml_node<char>const*,std::allocator<rapidxml::xml_node<char>const*>>>
              *)&this->stack_);
  return;
}

Assistant:

xml_iarchive()
    {
    }